

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool is_char_name(int c)

{
  bool local_9;
  int c_local;
  
  if ((((c < 0x61) || (0x7a < c)) && ((c < 0x41 || (0x5a < c)))) && ((c < 0x30 || (0x39 < c)))) {
    switch(c) {
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
    case 0x3b:
    case 0x3f:
    case 0x40:
    case 0x5f:
    case 0x7b:
    case 0x7d:
    case 0x7e:
      local_9 = true;
      break;
    default:
      local_9 = false;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

constexpr bool
is_char_name(const int c) noexcept
{
    if ((c >= static_cast<int>('a') && c <= static_cast<int>('z')) ||
        (c >= static_cast<int>('A') && c <= static_cast<int>('Z')) ||
        (c >= static_cast<int>('0') && c <= static_cast<int>('9')))
        return true;

    switch (c) {
    case '!':
    case '"':
    case '#':
    case '$':
    case '%':
    case '&':
    case '(':
    case ')':
    case ',':
    case '.':
    case ';':
    case '?':
    case '@':
    case '_':
    case '{':
    case '}':
    case '~':
        return true;
    default:
        return false;
    }
}